

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O1

lws_mqtt_stateful_primitive_return_t lws_mqtt_str_parse(lws_mqtt_str_t *s,uint8_t **in,size_t *len)

{
  ushort uVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  lws_mqtt_stateful_primitive_return_t lVar5;
  uint8_t *puVar6;
  uint16_t uVar7;
  uint uVar8;
  size_t sVar9;
  ushort uVar10;
  ulong size;
  byte *pbVar11;
  bool bVar12;
  
  pbVar11 = *in;
  sVar9 = *len;
  bVar12 = sVar9 == 0;
  if ((!bVar12) && (s->len_valid == '\0')) {
    while (uVar1 = s->pos, uVar1 < 2) {
      iVar2._0_2_ = s->len;
      iVar2._2_2_ = s->limit;
      pbVar3 = *in;
      pbVar11 = pbVar3 + 1;
      *in = pbVar11;
      size = (ulong)(ushort)(iVar2 << 8) | (ulong)*pbVar3;
      uVar10 = (ushort)size;
      s->len = uVar10;
      *len = sVar9 - 1;
      uVar7 = uVar1 + 1;
      s->pos = uVar7;
      if (uVar7 == 2) {
        if (s->limit < uVar10) {
          return LMSPR_FAILED_OVERSIZE;
        }
        s->pos = 0;
        s->len_valid = '\x01';
        if (uVar10 == 0) {
          return LMSPR_COMPLETED;
        }
        if (s->buf == (uint8_t *)0x0) {
          puVar6 = (uint8_t *)lws_realloc((void *)0x0,size,"lws_mqtt_str_parse");
          s->buf = puVar6;
          if (puVar6 == (uint8_t *)0x0) {
            return LMSPR_FAILED_OOM;
          }
          s->needs_freeing = '\x01';
        }
      }
      sVar9 = *len;
      bVar12 = sVar9 == 0;
      if ((bVar12) || (s->len_valid != '\0')) break;
    }
  }
  if ((!bVar12) && (s->len_valid != '\0')) {
    uVar4 = *(int *)&s->len - (uint)s->pos;
    uVar8 = (uint)sVar9;
    if ((uVar4 & 0xffff) <= sVar9) {
      uVar8 = uVar4;
    }
    memcpy(s->buf + s->pos,*in,(ulong)(uVar8 & 0xffff));
    *in = *in + (uVar8 & 0xffff);
    s->pos = s->pos + (short)uVar8;
  }
  *len = (size_t)(pbVar11 + (*len - (long)*in));
  if (s->buf == (uint8_t *)0x0) {
    lVar5 = LMSPR_NEED_MORE;
  }
  else {
    lVar5 = (lws_mqtt_stateful_primitive_return_t)(s->pos != s->len);
  }
  return lVar5;
}

Assistant:

lws_mqtt_stateful_primitive_return_t
lws_mqtt_str_parse(lws_mqtt_str_t *s, const uint8_t **in, size_t *len)
{
	const uint8_t *oin = *in;

	/* handle the length + allocation if needed */
	while (*len && !s->len_valid && s->pos < 2) {
		s->len = (s->len << 8) | *((*in)++);
		(*len)--;
		oin = *in;
		if (++s->pos == 2) {
			if (s->len > s->limit)
				return LMSPR_FAILED_OVERSIZE;

			s->pos = 0;
			s->len_valid = 1;

			if (!s->len) /* do not need to allocate */
				return LMSPR_COMPLETED;

			if (!s->buf) {
				s->buf = lws_malloc(s->len, __func__);
				if (!s->buf)
					return LMSPR_FAILED_OOM;

				s->needs_freeing = 1;
			}
		}
	}

	/* handle copying bulk data into allocation */
	if (s->len_valid && *len) {
		uint16_t span = s->len - s->pos;

		if (span > *len)
			span = *len;

		memcpy(s->buf + s->pos, *in, span);
		*in += span;
		s->pos += span;
	}

	*len -= *in - oin;

	return s->buf && s->pos == s->len ? LMSPR_COMPLETED : LMSPR_NEED_MORE;
}